

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ActivationParams::ActivationParams
          (ActivationParams *this,ActivationParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  ActivationSoftsign *this_00;
  ActivationLeakyReLU *this_01;
  ActivationSigmoidHard *this_02;
  ActivationTanh *this_03;
  ActivationParametricSoftplus *this_04;
  ActivationELU *this_05;
  ActivationSoftplus *this_06;
  ActivationScaledTanh *this_07;
  ActivationSigmoid *this_08;
  ActivationLinear *this_09;
  ActivationThresholdedReLU *this_10;
  ActivationReLU *this_11;
  ActivationPReLU *this_12;
  ActivationELU *from_00;
  ActivationSoftplus *from_01;
  ActivationScaledTanh *from_02;
  ActivationSoftsign *from_03;
  ActivationParametricSoftplus *from_04;
  ActivationSigmoid *from_05;
  ActivationLinear *from_06;
  ActivationThresholdedReLU *from_07;
  ActivationReLU *from_08;
  ActivationPReLU *from_09;
  ActivationSigmoidHard *from_10;
  ActivationLeakyReLU *from_11;
  ActivationTanh *from_12;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ActivationParams_003ba670;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x1f) {
    if ((int)uVar1 < 0x14) {
      if (uVar1 == 5) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 5;
        this_09 = (ActivationLinear *)operator_new(0x20);
        ActivationLinear::ActivationLinear(this_09);
        (this->NonlinearityType_).linear_ = this_09;
        if (from->_oneof_case_[0] == 5) {
          from_06 = (from->NonlinearityType_).linear_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_06 = (ActivationLinear *)&_ActivationLinear_default_instance_;
        }
        ActivationLinear::MergeFrom(this_09,from_06);
      }
      else if (uVar1 == 10) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 10;
        this_11 = (ActivationReLU *)operator_new(0x18);
        ActivationReLU::ActivationReLU(this_11);
        (this->NonlinearityType_).relu_ = this_11;
        if (from->_oneof_case_[0] == 10) {
          from_08 = (from->NonlinearityType_).relu_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_08 = (ActivationReLU *)&_ActivationReLU_default_instance_;
        }
        ActivationReLU::MergeFrom(this_11,from_08);
      }
      else if (uVar1 == 0xf) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0xf;
        this_01 = (ActivationLeakyReLU *)operator_new(0x18);
        ActivationLeakyReLU::ActivationLeakyReLU(this_01);
        (this->NonlinearityType_).leakyrelu_ = this_01;
        if (from->_oneof_case_[0] == 0xf) {
          from_11 = (from->NonlinearityType_).leakyrelu_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_11 = (ActivationLeakyReLU *)&_ActivationLeakyReLU_default_instance_;
        }
        ActivationLeakyReLU::MergeFrom(this_01,from_11);
      }
    }
    else if (uVar1 == 0x14) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x14;
      this_10 = (ActivationThresholdedReLU *)operator_new(0x18);
      ActivationThresholdedReLU::ActivationThresholdedReLU(this_10);
      (this->NonlinearityType_).thresholdedrelu_ = this_10;
      if (from->_oneof_case_[0] == 0x14) {
        from_07 = (from->NonlinearityType_).thresholdedrelu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_07 = (ActivationThresholdedReLU *)&_ActivationThresholdedReLU_default_instance_;
      }
      ActivationThresholdedReLU::MergeFrom(this_10,from_07);
    }
    else if (uVar1 == 0x19) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x19;
      this_12 = (ActivationPReLU *)operator_new(0x20);
      ActivationPReLU::ActivationPReLU(this_12);
      (this->NonlinearityType_).prelu_ = this_12;
      if (from->_oneof_case_[0] == 0x19) {
        from_09 = (from->NonlinearityType_).prelu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_09 = (ActivationPReLU *)&_ActivationPReLU_default_instance_;
      }
      ActivationPReLU::MergeFrom(this_12,from_09);
    }
    else if (uVar1 == 0x1e) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x1e;
      this_03 = (ActivationTanh *)operator_new(0x18);
      ActivationTanh::ActivationTanh(this_03);
      (this->NonlinearityType_).tanh_ = this_03;
      if (from->_oneof_case_[0] == 0x1e) {
        from_12 = (from->NonlinearityType_).tanh_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_12 = (ActivationTanh *)&_ActivationTanh_default_instance_;
      }
      ActivationTanh::MergeFrom(this_03,from_12);
    }
  }
  else if ((int)uVar1 < 0x32) {
    if (uVar1 == 0x1f) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x1f;
      this_07 = (ActivationScaledTanh *)operator_new(0x20);
      ActivationScaledTanh::ActivationScaledTanh(this_07);
      (this->NonlinearityType_).scaledtanh_ = this_07;
      if (from->_oneof_case_[0] == 0x1f) {
        from_02 = (from->NonlinearityType_).scaledtanh_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_02 = (ActivationScaledTanh *)&_ActivationScaledTanh_default_instance_;
      }
      ActivationScaledTanh::MergeFrom(this_07,from_02);
    }
    else if (uVar1 == 0x28) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x28;
      this_08 = (ActivationSigmoid *)operator_new(0x18);
      ActivationSigmoid::ActivationSigmoid(this_08);
      (this->NonlinearityType_).sigmoid_ = this_08;
      if (from->_oneof_case_[0] == 0x28) {
        from_05 = (from->NonlinearityType_).sigmoid_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_05 = (ActivationSigmoid *)&_ActivationSigmoid_default_instance_;
      }
      ActivationSigmoid::MergeFrom(this_08,from_05);
    }
    else if (uVar1 == 0x29) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x29;
      this_02 = (ActivationSigmoidHard *)operator_new(0x20);
      ActivationSigmoidHard::ActivationSigmoidHard(this_02);
      (this->NonlinearityType_).sigmoidhard_ = this_02;
      if (from->_oneof_case_[0] == 0x29) {
        from_10 = (from->NonlinearityType_).sigmoidhard_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_10 = (ActivationSigmoidHard *)&_ActivationSigmoidHard_default_instance_;
      }
      ActivationSigmoidHard::MergeFrom(this_02,from_10);
    }
  }
  else if ((int)uVar1 < 0x46) {
    if (uVar1 == 0x32) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x32;
      this_05 = (ActivationELU *)operator_new(0x18);
      ActivationELU::ActivationELU(this_05);
      (this->NonlinearityType_).elu_ = this_05;
      if (from->_oneof_case_[0] == 0x32) {
        from_00 = (from->NonlinearityType_).elu_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (ActivationELU *)&_ActivationELU_default_instance_;
      }
      ActivationELU::MergeFrom(this_05,from_00);
    }
    else if (uVar1 == 0x3c) {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x3c;
      this_00 = (ActivationSoftsign *)operator_new(0x18);
      ActivationSoftsign::ActivationSoftsign(this_00);
      (this->NonlinearityType_).softsign_ = this_00;
      if (from->_oneof_case_[0] == 0x3c) {
        from_03 = (from->NonlinearityType_).softsign_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_03 = (ActivationSoftsign *)&_ActivationSoftsign_default_instance_;
      }
      ActivationSoftsign::MergeFrom(this_00,from_03);
    }
  }
  else if (uVar1 == 0x46) {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x46;
    this_06 = (ActivationSoftplus *)operator_new(0x18);
    ActivationSoftplus::ActivationSoftplus(this_06);
    (this->NonlinearityType_).softplus_ = this_06;
    if (from->_oneof_case_[0] == 0x46) {
      from_01 = (from->NonlinearityType_).softplus_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (ActivationSoftplus *)&_ActivationSoftplus_default_instance_;
    }
    ActivationSoftplus::MergeFrom(this_06,from_01);
  }
  else if (uVar1 == 0x47) {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x47;
    this_04 = (ActivationParametricSoftplus *)operator_new(0x28);
    ActivationParametricSoftplus::ActivationParametricSoftplus(this_04);
    (this->NonlinearityType_).parametricsoftplus_ = this_04;
    if (from->_oneof_case_[0] == 0x47) {
      from_04 = (from->NonlinearityType_).parametricsoftplus_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_04 = (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_;
    }
    ActivationParametricSoftplus::MergeFrom(this_04,from_04);
  }
  return;
}

Assistant:

ActivationParams::ActivationParams(const ActivationParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_NonlinearityType();
  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ActivationParams)
}